

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticDescriptor.h
# Opt level: O0

void __thiscall psy::DiagnosticDescriptor::~DiagnosticDescriptor(DiagnosticDescriptor *this)

{
  DiagnosticDescriptor *this_local;
  
  std::__cxx11::string::~string((string *)&this->description_);
  std::__cxx11::string::~string((string *)&this->title_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

class PSY_API DiagnosticDescriptor
{
public:
    DiagnosticDescriptor(std::string id,
                         std::string title,
                         std::string description,
                         DiagnosticSeverity defaultSeverity,
                         DiagnosticCategory category);

    /**
     * The Id of \c this DiagnosticDescriptor.
     */
    const std::string& id() const;

    /**
     * The title of \c this DiagnosticDescriptor.
     */
    const std::string& title() const;

    /**
     * The description of \c this DiagnosticDescriptor.
     */
    const std::string& description() const;

    /**
     * The default severity of \c this DiagnosticDescriptor.
     */
    DiagnosticSeverity defaultSeverity() const;

    /**
     * The category of \c this DiagnosticDescriptor.
     */
    DiagnosticCategory category() const;

private:
    std::string id_;
    std::string title_;
    std::string description_;
    DiagnosticSeverity defaultSeverity_;
    DiagnosticCategory category_;
}